

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_parse_monetary_values::test_method(rpc_parse_monetary_values *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffda28;
  lazy_ostream *in_stack_ffffffffffffda30;
  char *in_stack_ffffffffffffda38;
  string *in_stack_ffffffffffffda40;
  const_string *in_stack_ffffffffffffda50;
  size_t in_stack_ffffffffffffda58;
  const_string *in_stack_ffffffffffffda60;
  undefined7 in_stack_ffffffffffffda68;
  undefined1 in_stack_ffffffffffffda6f;
  UniValue *in_stack_ffffffffffffda70;
  UniValue *in_stack_ffffffffffffda78;
  undefined8 in_stack_ffffffffffffda88;
  int decimals;
  UniValue *in_stack_ffffffffffffda90;
  UniValue *value;
  UniValue *ex_8;
  UniValue *ex_7;
  UniValue *ex_6;
  UniValue *ex_5;
  UniValue *ex_4;
  UniValue *ex_3;
  UniValue *ex_2;
  UniValue *ex_1;
  UniValue *ex;
  rpc_parse_monetary_values *this_local;
  const_string local_1d30;
  lazy_ostream local_1d20 [2];
  assertion_result local_1d00 [2];
  allocator<char> local_1cc1 [137];
  const_string local_1c38;
  lazy_ostream local_1c28 [2];
  assertion_result local_1c08 [2];
  allocator<char> local_1bc9 [137];
  const_string local_1b40;
  lazy_ostream local_1b30 [2];
  assertion_result local_1b10 [2];
  allocator<char> local_1ad1 [137];
  const_string local_1a48;
  lazy_ostream local_1a38 [2];
  assertion_result local_1a18 [2];
  allocator<char> local_19d9 [145];
  const_string local_1948;
  lazy_ostream local_1938 [2];
  assertion_result local_1918 [3];
  undefined1 local_18c0 [8];
  CAmount local_18b8;
  undefined1 local_18b0 [16];
  undefined1 local_18a0 [168];
  const_string local_17f8;
  lazy_ostream local_17e8 [2];
  assertion_result local_17c8 [2];
  allocator<char> local_1789 [33];
  undefined1 local_1768 [16];
  CAmount local_1758;
  undefined1 local_1750 [16];
  undefined1 local_1740 [168];
  const_string local_1698;
  lazy_ostream local_1688 [2];
  assertion_result local_1668 [2];
  allocator<char> local_1629 [137];
  const_string local_15a0;
  lazy_ostream local_1590 [2];
  assertion_result local_1570 [2];
  allocator<char> local_1531 [40];
  allocator<char> local_1509;
  CAmount local_1508;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [71];
  allocator<char> local_14a9;
  CAmount local_14a8;
  undefined1 local_14a0 [16];
  undefined1 local_1490 [64];
  undefined1 local_1450 [16];
  CAmount local_1440;
  undefined1 local_1438 [16];
  undefined1 local_1428 [64];
  undefined1 local_13e8 [8];
  CAmount local_13e0;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [64];
  undefined1 local_1388 [16];
  CAmount local_1378;
  undefined1 local_1370 [16];
  undefined1 local_1360 [64];
  undefined1 local_1320 [16];
  CAmount local_1310;
  undefined1 local_1308 [16];
  undefined1 local_12f8 [64];
  undefined1 local_12b8 [16];
  CAmount local_12a8;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [64];
  undefined1 local_1250 [16];
  CAmount local_1240;
  undefined1 local_1238 [16];
  undefined1 local_1228 [64];
  undefined1 local_11e8 [16];
  CAmount local_11d8;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [16];
  CAmount local_1170;
  undefined1 local_1168 [16];
  undefined1 local_1158 [64];
  undefined1 local_1118 [16];
  CAmount local_1108;
  undefined1 local_1100 [16];
  undefined1 local_10f0 [64];
  undefined1 local_10b0 [16];
  CAmount local_10a0;
  undefined1 local_1098 [16];
  undefined1 local_1088 [64];
  undefined1 local_1048 [16];
  CAmount local_1038;
  undefined1 local_1030 [16];
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined1 local_fe0 [16];
  CAmount local_fd0;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [64];
  undefined1 local_f78 [16];
  CAmount local_f68;
  undefined1 local_f60 [16];
  undefined1 local_f50 [64];
  undefined1 local_f10 [16];
  CAmount local_f00;
  undefined1 local_ef8 [16];
  undefined1 local_ee8 [64];
  undefined1 local_ea8 [16];
  CAmount local_e98;
  undefined1 local_e90 [16];
  undefined1 local_e80 [168];
  const_string local_dd8;
  lazy_ostream local_dc8 [2];
  assertion_result local_da8 [2];
  allocator<char> local_d69 [3425];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_d69);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_da8,local_dc8,&local_dd8,0x119,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_e98 = AmountFromValue(in_stack_ffffffffffffda90,
                                (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_ea8._0_8_ = (_func_int **)0x0;
    in_stack_ffffffffffffda38 = "0LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_ea8;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_e80,local_e90,0x11a,1,2,&local_e98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_ea8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_f00 = AmountFromValue(in_stack_ffffffffffffda90,
                                (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_f10._0_8_ = (_func_int **)0x0;
    in_stack_ffffffffffffda38 = "0LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_f10;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.00000000\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_ee8,local_ef8,0x11b,1,2,&local_f00);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_f10 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_f68 = AmountFromValue(in_stack_ffffffffffffda90,
                                (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_f78._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffda38 = "1LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_f78;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.00000001\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_f50,local_f60,0x11c,1,2,&local_f68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_f78 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_fd0 = AmountFromValue(in_stack_ffffffffffffda90,
                                (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_fe0._0_8_ = (_func_int **)0x10ce4b3;
    in_stack_ffffffffffffda38 = "17622195LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_fe0;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.17622195\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_fb8,local_fc8,0x11d,1,2,&local_fd0);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_fe0 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1038 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1048._0_8_ = (_func_int **)0x2faf080;
    in_stack_ffffffffffffda38 = "50000000LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1048;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.5\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_1020,local_1030,0x11e,1,2,&local_1038);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1048 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_10a0 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_10b0._0_8_ = (_func_int **)0x2faf080;
    in_stack_ffffffffffffda38 = "50000000LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_10b0;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.50000000\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_1088,local_1098,0x11f,1,2,&local_10a0);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_10b0 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1108 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1118._0_8_ = (_func_int **)0x55bbfed;
    in_stack_ffffffffffffda38 = "89898989LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1118;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.89898989\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_10f0,local_1100,0x120,1,2,&local_1108);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1118 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1170 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1180._0_8_ = (_func_int **)0x5f5e100;
    in_stack_ffffffffffffda38 = "100000000LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1180;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"1.00000000\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_1158,local_1168,0x121,1,2,&local_1170);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1180 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_11d8 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_11e8._0_8_ = (_func_int **)0x775f05a073ff6;
    in_stack_ffffffffffffda38 = "2099999999999990LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_11e8;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"20999999.9999999\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_11c0,local_11d0,0x122,1,2,&local_11d8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_11e8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1240 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1250._0_8_ = (_func_int **)0x775f05a073fff;
    in_stack_ffffffffffffda38 = "2099999999999999LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1250;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"20999999.99999999\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_1228,local_1238,0x123,1,2,&local_1240);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1250 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_12a8 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_12b8._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffda38 = "COIN/100000000";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_12b8;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"1e-8\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1290,local_12a0,0x125,1,2,&local_12a8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_12b8 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1310 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1320._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffda38 = "COIN/100000000";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1320;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.1e-7\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_12f8,local_1308,0x126,1,2,&local_1310);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1320 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1378 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1388._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffda38 = "COIN/100000000";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1388;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.01e-6\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1360,local_1370,0x127,1,2,&local_1378);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1388 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_13e0 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_13e8._0_4_ = 1;
    in_stack_ffffffffffffda38 = "1";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_13e8;
    in_stack_ffffffffffffda28 =
         "AmountFromValue(ValueFromString(\"0.00000000000000000000000000000000000001e+30\"))";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_13c8,local_13d8,0x128,1,2,&local_13e0);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_13e8 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1440 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1450._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffda38 = "COIN/100000000";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1450;
    in_stack_ffffffffffffda28 =
         "AmountFromValue(ValueFromString(\"0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68\"))"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1428,local_1438,0x129,1,2,&local_1440);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1450 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_14a8 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    in_stack_ffffffffffffda38 = "COIN";
    in_stack_ffffffffffffda30 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffda28 =
         "AmountFromValue(ValueFromString(\"10000000000000000000000000000000000000000000000000000000000000000e-64\"))"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1490,local_14a0,0x12a,1,2,&local_14a8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(&local_14a9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1508 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    in_stack_ffffffffffffda38 = "COIN";
    in_stack_ffffffffffffda30 = (lazy_ostream *)&COIN;
    in_stack_ffffffffffffda28 =
         "AmountFromValue(ValueFromString(\"0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64\"))"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_14f0,local_1500,299,1,2,&local_1508);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(&local_1509);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_1531);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1570,local_1590,&local_15a0,0x12d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_1629);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1668,local_1688,&local_1698,0x12e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_1758 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_1768._0_8_ = (_func_int **)0x1;
    in_stack_ffffffffffffda38 = "1LL";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_1768;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.00000001000000\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_1740,local_1750,0x12f,1,2,&local_1758);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_1768 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_1789);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_17c8,local_17e8,&local_17f8,0x130,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda30,(char (*) [1])in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    local_18b8 = AmountFromValue(in_stack_ffffffffffffda90,
                                 (int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    local_18c0._0_4_ = 0x13;
    in_stack_ffffffffffffda38 = "19";
    in_stack_ffffffffffffda30 = (lazy_ostream *)local_18c0;
    in_stack_ffffffffffffda28 = "AmountFromValue(ValueFromString(\"0.19e-6\"))";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_18a0,local_18b0,0x131,1,2,&local_18b8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator((allocator<char> *)(local_18c0 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    UniValue::UniValue<const_char_(&)[7],_char[7],_true>
              (in_stack_ffffffffffffda70,
               (char (*) [7])CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1918,local_1938,&local_1948,0x132,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_19d9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1a18,local_1a38,&local_1a48,0x134,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_1ad1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1b10,local_1b30,&local_1b40,0x135,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(in_stack_ffffffffffffda90,(int)((ulong)in_stack_ffffffffffffda88 >> 0x20));
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_1bc9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1c08,local_1c28,&local_1c38,0x136,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    value = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
               (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
               in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
    decimals = (int)((ulong)local_1cc1 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda78,(char *)in_stack_ffffffffffffda70,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68));
    ValueFromString(in_stack_ffffffffffffda40);
    AmountFromValue(value,decimals);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffda28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffda28);
    std::allocator<char>::~allocator(local_1cc1);
    do {
      in_stack_ffffffffffffda78 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffda6f,in_stack_ffffffffffffda68),
                 in_stack_ffffffffffffda60,in_stack_ffffffffffffda58,in_stack_ffffffffffffda50);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffda38,
                 SUB81((ulong)in_stack_ffffffffffffda30 >> 0x38,0));
      in_stack_ffffffffffffda70 = (UniValue *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda30,(char (*) [43])in_stack_ffffffffffffda28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38,
                 (pointer)in_stack_ffffffffffffda30,(unsigned_long)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1d00,local_1d20,&local_1d30,0x137,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_ffffffffffffda28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffda28);
      in_stack_ffffffffffffda6f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffda6f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_parse_monetary_values)
{
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("-0.00000001")), UniValue);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0")), 0LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000000")), 0LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000001")), 1LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.17622195")), 17622195LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.5")), 50000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.50000000")), 50000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.89898989")), 89898989LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("1.00000000")), 100000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("20999999.9999999")), 2099999999999990LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("20999999.99999999")), 2099999999999999LL);

    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("1e-8")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.1e-7")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.01e-6")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000000000000000000000000000000000001e+30")), 1);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("10000000000000000000000000000000000000000000000000000000000000000e-64")), COIN);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64")), COIN);

    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e-9")), UniValue); //should fail
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("0.000000019")), UniValue); //should fail
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000001000000")), 1LL); //should pass, cut trailing 0
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("19e-9")), UniValue); //should fail
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.19e-6")), 19); //should pass, leading 0 is present
    BOOST_CHECK_EXCEPTION(AmountFromValue(".19e-6"), UniValue, HasJSON(R"({"code":-3,"message":"Invalid amount"})")); //should fail, no leading 0

    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("92233720368.54775808")), UniValue); //overflow error
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e+11")), UniValue); //overflow error
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e11")), UniValue); //overflow error signless
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("93e+9")), UniValue); //overflow error
}